

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatementBlock.h
# Opt level: O0

void __thiscall StatementBlock::execute(StatementBlock *this,Environment *env)

{
  bool bVar1;
  __shared_ptr_access<Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  ptr<Statement> *statement;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_> *__range1;
  Environment *env_local;
  StatementBlock *this_local;
  
  __end1 = std::vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>::
           begin(&this->statements);
  statement = (ptr<Statement> *)
              std::vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>
              ::end(&this->statements);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<Statement>_*,_std::vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>_>
                                *)&statement);
    if (!bVar1) break;
    this_00 = (__shared_ptr_access<Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<Statement>_*,_std::vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>_>
              ::operator*(&__end1);
    peVar2 = std::__shared_ptr_access<Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    (**peVar2->_vptr_Statement)(peVar2,env);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Statement>_*,_std::vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void execute(Environment* env) override {
        for(ptr<Statement>& statement : statements) {
            statement -> execute(env);
        }
    }